

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object get_undo_handler(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object *in_RSI;
  Am_Object local_40 [3];
  undefined1 local_21;
  Am_Object local_20;
  Am_Object panel;
  Am_Object *cmd_local;
  Am_Object *undo_handler;
  
  Am_Object::Am_Object(&local_20);
  local_21 = 0;
  Am_Object::Am_Object(cmd);
  pAVar1 = Am_Object::Get(in_RSI,0x170,0);
  Am_Object::operator=(&local_20,pAVar1);
  Am_Object::Get_Owner(local_40,(Am_Slot_Flags)&local_20);
  pAVar1 = Am_Object::Get(local_40,Am_UNDO_HANDLER_TO_DISPLAY,0);
  Am_Object::operator=(cmd,pAVar1);
  Am_Object::~Am_Object(local_40);
  local_21 = 1;
  Am_Object::~Am_Object(&local_20);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_undo_handler(Am_Object cmd)
{
  Am_Object panel, undo_handler;
  //Am_SAVED_OLD_OWNER of cmd is button_panel, owner is db
  panel = cmd.Get(Am_SAVED_OLD_OWNER);
  undo_handler = panel.Get_Owner().Get(Am_UNDO_HANDLER_TO_DISPLAY);
  return undo_handler;
}